

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1TupleType<double,4ul>
          (AsciiParser *this,char sep,
          vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *result)

{
  pointer *ppaVar1;
  pointer paVar2;
  iterator iVar3;
  bool bVar4;
  StreamReader *pSVar5;
  ulong uVar6;
  _Alloc_hider _Var7;
  array<double,_4UL> value;
  char c;
  string local_68;
  string local_48;
  
  paVar2 = (result->
           super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>).
      _M_impl.super__Vector_impl_data._M_finish != paVar2) {
    (result->super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>)
    ._M_impl.super__Vector_impl_data._M_finish = paVar2;
  }
  bVar4 = SkipWhitespaceAndNewline(this,true);
  if (bVar4) {
    bVar4 = ParseBasicTypeTuple<double,4ul>(this,(array<double,_4UL> *)&local_68);
    if (bVar4) {
      iVar3._M_current =
           (result->
           super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (result->
          super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>::
        _M_realloc_insert<std::array<double,4ul>const&>
                  ((vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>> *)result,
                   iVar3,(array<double,_4UL> *)&local_68);
      }
      else {
        (iVar3._M_current)->_M_elems[2] = (double)local_68.field_2._M_allocated_capacity;
        (iVar3._M_current)->_M_elems[3] = (double)local_68.field_2._8_8_;
        (iVar3._M_current)->_M_elems[0] = (double)local_68._M_dataplus._M_p;
        (iVar3._M_current)->_M_elems[1] = (double)local_68._M_string_length;
        ppaVar1 = &(result->
                   super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      pSVar5 = this->_sr;
      uVar6 = pSVar5->idx_;
      if (uVar6 < pSVar5->length_) {
        while (pSVar5->binary_[uVar6] != '\0') {
          bVar4 = SkipWhitespaceAndNewline(this,true);
          if (!bVar4) {
            return false;
          }
          bVar4 = Char1(this,(char *)&local_48);
          if (!bVar4) {
            return false;
          }
          if ((char)local_48._M_dataplus._M_p != sep) {
            pSVar5 = this->_sr;
            if ((0 < (long)pSVar5->idx_) && (uVar6 = pSVar5->idx_ - 1, uVar6 <= pSVar5->length_)) {
              pSVar5->idx_ = uVar6;
            }
            break;
          }
          bVar4 = SkipWhitespaceAndNewline(this,true);
          if (!bVar4) {
            return false;
          }
          bVar4 = ParseBasicTypeTuple<double,4ul>(this,(array<double,_4UL> *)&local_68);
          if (!bVar4) break;
          iVar3._M_current =
               (result->
               super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (result->
              super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>::
            _M_realloc_insert<std::array<double,4ul>const&>
                      ((vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>> *)
                       result,iVar3,(array<double,_4UL> *)&local_68);
          }
          else {
            (iVar3._M_current)->_M_elems[2] = (double)local_68.field_2._M_allocated_capacity;
            (iVar3._M_current)->_M_elems[3] = (double)local_68.field_2._8_8_;
            (iVar3._M_current)->_M_elems[0] = (double)local_68._M_dataplus._M_p;
            (iVar3._M_current)->_M_elems[1] = (double)local_68._M_string_length;
            ppaVar1 = &(result->
                       super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
          }
          pSVar5 = this->_sr;
          uVar6 = pSVar5->idx_;
          if (pSVar5->length_ <= uVar6) break;
        }
      }
      if ((result->
          super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (result->
          super__Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Empty array.\n","");
      PushError(this,&local_68);
      local_48.field_2._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
      _Var7._M_p = local_68._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == &local_68.field_2) {
        return false;
      }
    }
    else {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Not starting with the tuple value of requested type.\n","");
      PushError(this,&local_48);
      _Var7._M_p = local_48._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return false;
      }
    }
    operator_delete(_Var7._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1TupleType(const char sep,
                                  std::vector<std::array<T, N>> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      PushError("Not starting with the tuple value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    std::array<T, N> value;
    if (!ParseBasicTypeTuple<T, N>(&value)) {
      break;
    }

    result->push_back(value);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}